

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  archive_acl *acl_00;
  byte *pbVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  archive_acl_entry *paVar8;
  byte *pbVar9;
  wchar_t wVar10;
  int *piVar11;
  ulong uVar12;
  wchar_t wVar13;
  byte *pbVar14;
  char *pcVar15;
  ulong uVar16;
  int iVar17;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_b0;
  wchar_t local_ac;
  byte *local_a8;
  byte *local_a0;
  wchar_t local_98;
  wchar_t local_94;
  ulong local_90;
  int *local_88 [4];
  char *local_68;
  char *local_60;
  byte *local_58;
  byte *local_50;
  archive_string_conv *local_40;
  archive_acl *local_38;
  
  if ((text == (char *)0x0) || (*text == '\0')) {
    return L'\0';
  }
  uVar16 = 0;
  local_94 = default_type;
  local_40 = sc;
  local_38 = acl;
  do {
    uVar1 = 0;
    do {
      while ((uVar12 = uVar1, pbVar9 = (byte *)text, (ulong)(byte)*text < 0x21 &&
             ((0x100000600U >> ((ulong)(byte)*text & 0x3f) & 1) != 0))) {
        text = (char *)((byte *)text + 1);
        uVar1 = uVar12;
      }
      while( true ) {
        bVar2 = *pbVar9;
        if (((ulong)bVar2 < 0x3b) &&
           (pbVar5 = pbVar9, (0x400100000000401U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
        pbVar9 = pbVar9 + 1;
      }
      do {
        pbVar14 = pbVar5;
        if (0x20 < (ulong)pbVar14[-1]) break;
        pbVar5 = pbVar14 + -1;
      } while ((0x100000600U >> ((ulong)pbVar14[-1] & 0x3f) & 1) != 0);
      bVar3 = *pbVar9;
      if (uVar12 < 4) {
        local_88[uVar12 * 2] = (int *)text;
        local_88[uVar12 * 2 + 1] = (int *)pbVar14;
      }
      uVar1 = uVar12 + 1;
      text = (char *)(pbVar9 + (bVar3 != 0));
    } while (bVar2 == 0x3a);
    text = (char *)(pbVar9 + (bVar3 != 0));
    if (uVar12 < 3) {
      memset(local_88 + uVar12 * 2 + 2,0,(uVar12 * -0x10 + 0x20 & 0xffffffff0) + 0x10);
    }
    if (local_88[2] < local_88[3]) {
      wVar6 = L'\0';
      pbVar9 = (byte *)local_88[2];
      do {
        bVar2 = *pbVar9;
        if ((byte)(bVar2 - 0x3a) < 0xf6) goto LAB_001124e7;
        wVar13 = L'\x7fffffff';
        if ((wVar6 < L'\x0ccccccd') && ((wVar6 != L'\x0ccccccc' || ((char)bVar2 < '8')))) {
          wVar13 = (uint)bVar2 + wVar6 * 10 + L'\xffffffd0';
        }
        wVar6 = wVar13;
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (byte *)local_88[3]);
    }
    else {
LAB_001124e7:
      wVar6 = L'\xffffffff';
    }
    local_98 = wVar6;
    if ((2 < uVar12 && wVar6 == L'\xffffffff') && (local_58 < local_50)) {
      wVar13 = L'\0';
      pbVar9 = local_58;
      do {
        bVar2 = *pbVar9;
        local_98 = wVar6;
        if ((byte)(bVar2 - 0x3a) < 0xf6) break;
        wVar7 = L'\x7fffffff';
        if ((wVar13 < L'\x0ccccccd') && ((wVar13 != L'\x0ccccccc' || ((char)bVar2 < '8')))) {
          wVar7 = (uint)bVar2 + wVar13 * 10 + L'\xffffffd0';
        }
        wVar13 = wVar7;
        pbVar9 = pbVar9 + 1;
        local_98 = wVar13;
      } while (pbVar9 != local_50);
    }
    local_b0 = local_94;
    if ((7 < (long)local_88[1] - (long)local_88[0]) &&
       (*(int *)((long)local_88[0] + 3) == 0x746c7561 && *local_88[0] == 0x61666564)) {
      local_88[0] = (int *)((long)local_88[0] + 7);
      local_b0 = L'Ȁ';
    }
    if (local_88[0] == local_88[1]) {
      return L'\xffffffec';
    }
    local_a0 = (byte *)local_88[3];
    local_a8 = (byte *)local_88[2];
    local_90 = uVar16;
    if ((char)*local_88[0] == 'u') {
      piVar11 = (int *)((long)local_88[0] + 1);
      pcVar15 = "user";
      do {
        pcVar15 = pcVar15 + 1;
        if (local_88[1] <= piVar11) break;
        iVar17 = *piVar11;
        piVar11 = (int *)((long)piVar11 + 1);
      } while ((char)iVar17 == *pcVar15);
      if (piVar11 < local_88[1]) goto LAB_001125f1;
      wVar6 = ismode(local_68,local_60,&local_ac);
      if (wVar6 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_a8 < local_a0) || (local_98 != L'\xffffffff')) {
        wVar6 = L'✑';
        goto LAB_0011282d;
      }
      wVar6 = L'✒';
LAB_0011281b:
      local_a0 = (byte *)0x0;
      local_a8 = (byte *)0x0;
    }
    else {
LAB_001125f1:
      if (local_88[0] == local_88[1]) {
        return L'\xffffffec';
      }
      if ((char)*local_88[0] != 'g') {
LAB_0011262a:
        if (local_88[0] == local_88[1]) {
          return L'\xffffffec';
        }
        iVar17 = (int)uVar12;
        if ((char)*local_88[0] == 'o') {
          piVar11 = (int *)((long)local_88[0] + 1);
          pcVar15 = "other";
          do {
            pcVar15 = pcVar15 + 1;
            if (local_88[1] <= piVar11) break;
            iVar4 = *piVar11;
            piVar11 = (int *)((long)piVar11 + 1);
          } while ((char)iVar4 == *pcVar15);
          if (local_88[1] <= piVar11) {
            if (iVar17 == 2) {
LAB_001127e3:
              if (local_a8 != local_a0) {
                return L'\xffffffec';
              }
              if (local_60 <= local_68) {
                return L'\xffffffec';
              }
              wVar6 = ismode(local_68,local_60,&local_ac);
              if (wVar6 == L'\0') {
                return L'\xffffffec';
              }
            }
            else {
              if (iVar17 != 1) {
                return L'\xffffffec';
              }
              if ((local_88[3] <= local_88[2]) ||
                 (wVar6 = ismode((char *)local_88[2],(char *)local_88[3],&local_ac), wVar6 == L'\0')
                 ) {
                if (uVar1 != 3) {
                  return L'\xffffffec';
                }
                goto LAB_001127e3;
              }
            }
            wVar6 = L'✖';
            goto LAB_0011281b;
          }
        }
        if (local_88[0] == local_88[1]) {
          return L'\xffffffec';
        }
        if ((char)*local_88[0] != 'm') {
          return L'\xffffffec';
        }
        piVar11 = (int *)((long)local_88[0] + 1);
        pcVar15 = "mask";
        do {
          pcVar15 = pcVar15 + 1;
          if (local_88[1] <= piVar11) break;
          iVar4 = *piVar11;
          piVar11 = (int *)((long)piVar11 + 1);
        } while ((char)iVar4 == *pcVar15);
        if (piVar11 < local_88[1]) {
          return L'\xffffffec';
        }
        if (iVar17 == 2) {
LAB_001126e3:
          if ((local_a8 != local_a0) || (local_60 <= local_68)) {
            return L'\xffffffec';
          }
          wVar6 = ismode(local_68,local_60,&local_ac);
          if (wVar6 == L'\0') {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar17 != 1) {
            return L'\xffffffec';
          }
          if ((local_88[3] <= local_88[2]) ||
             (wVar6 = ismode((char *)local_88[2],(char *)local_88[3],&local_ac), wVar6 == L'\0')) {
            if (uVar1 != 3) {
              return L'\xffffffec';
            }
            goto LAB_001126e3;
          }
        }
        wVar6 = L'✕';
        goto LAB_0011281b;
      }
      piVar11 = (int *)((long)local_88[0] + 1);
      pcVar15 = "group";
      do {
        pcVar15 = pcVar15 + 1;
        if (local_88[1] <= piVar11) break;
        iVar17 = *piVar11;
        piVar11 = (int *)((long)piVar11 + 1);
      } while ((char)iVar17 == *pcVar15);
      if (piVar11 < local_88[1]) goto LAB_0011262a;
      wVar6 = ismode(local_68,local_60,&local_ac);
      if (wVar6 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_a0 <= local_a8) && (local_98 == L'\xffffffff')) {
        wVar6 = L'✔';
        goto LAB_0011281b;
      }
      wVar6 = L'✓';
    }
LAB_0011282d:
    acl_00 = local_38;
    wVar13 = local_ac;
    wVar7 = acl_special(local_38,local_b0,local_ac,wVar6);
    wVar10 = L'\0';
    uVar16 = local_90;
    if (wVar7 != L'\0') {
      paVar8 = acl_new_entry(acl_00,local_b0,wVar13,wVar6,local_98);
      uVar16 = local_90;
      if (paVar8 == (archive_acl_entry *)0x0) {
        wVar10 = L'\xffffffe7';
      }
      else if (((local_a8 == (byte *)0x0) || (local_a0 == local_a8)) || (*local_a8 == 0)) {
        archive_mstring_clean(&paVar8->name);
        wVar10 = L'\0';
      }
      else {
        wVar6 = archive_mstring_copy_mbs_len_l
                          (&paVar8->name,(char *)local_a8,(long)local_a0 - (long)local_a8,local_40);
        wVar10 = L'\0';
        if (wVar6 != L'\0') {
          piVar11 = __errno_location();
          wVar10 = L'\xffffffec';
          if (*piVar11 == 0xc) {
            wVar10 = L'\xffffffe2';
          }
        }
      }
    }
    if (wVar10 < L'\xffffffec') {
      return wVar10;
    }
    uVar16 = uVar16 & 0xffffffff;
    if (wVar10 != L'\0') {
      uVar16 = 0xffffffec;
    }
    if (*text == 0) {
      return (wchar_t)uVar16;
    }
  } while( true );
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}